

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intCore.c
# Opt level: O0

int Inter_ManPerformInterpolation(Aig_Man_t *pAig,Inter_ManParams_t *pPars,int *piFrame)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  abctime aVar9;
  abctime aVar10;
  Inter_Man_t *p_00;
  Aig_Man_t *pAVar11;
  Cnf_Dat_t *pCVar12;
  abctime aVar13;
  abctime aVar14;
  Aig_Man_t *pAVar15;
  Aig_Obj_t *pAVar16;
  Aig_Obj_t *pAVar17;
  abctime local_130;
  Saig_ParBmc_t *pParsBmc;
  Saig_ParBmc_t ParsBmc;
  int RetValue_1;
  Cnf_Dat_t *pCnfInter2;
  abctime nTimeNewOut;
  abctime timeTemp;
  abctime clkTotal;
  abctime clk2;
  abctime clk;
  int Status;
  int RetValue;
  int i;
  int s;
  Aig_Man_t *pAigTemp;
  Inter_Check_t *pCheck;
  Inter_Man_t *p;
  int *piFrame_local;
  Inter_ManParams_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  pAigTemp = (Aig_Man_t *)0x0;
  aVar9 = Abc_Clock();
  nTimeNewOut = 0;
  if (pPars->nSecLimit == 0) {
    local_130 = 0;
  }
  else {
    iVar2 = pPars->nSecLimit;
    aVar10 = Abc_Clock();
    local_130 = (long)iVar2 * 1000000 + aVar10;
  }
  if (1 < pPars->nFramesK) {
    pPars->fTransLoop = 1;
  }
  iVar2 = Saig_ManRegNum(pAig);
  if (iVar2 < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                  ,0x5e,"int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)"
                 );
  }
  iVar2 = Saig_ManPiNum(pAig);
  if (iVar2 < 1) {
    __assert_fail("Saig_ManPiNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                  ,0x5f,"int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)"
                 );
  }
  iVar2 = Saig_ManPoNum(pAig);
  iVar3 = Saig_ManConstrNum(pAig);
  if (iVar2 - iVar3 != 1) {
    __assert_fail("Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                  ,0x60,"int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)"
                 );
  }
  if ((pPars->fVerbose != 0) && (iVar2 = Saig_ManConstrNum(pAig), iVar2 != 0)) {
    uVar4 = Saig_ManConstrNum(pAig);
    printf("Performing interpolation with %d constraints...\n",(ulong)uVar4);
  }
  iVar2 = Inter_ManCheckInitialState(pAig);
  if (iVar2 != 0) {
    *piFrame = -1;
    printf("Property trivially fails in the initial state.\n");
    return 0;
  }
  p_00 = Inter_ManCreate(pAig,pPars);
  if (pPars->fTransLoop == 0) {
    pAVar11 = Inter_ManStartDuplicated(pAig);
    p_00->pAigTrans = pAVar11;
  }
  else {
    pAVar11 = Inter_ManStartOneOutput(pAig,0);
    p_00->pAigTrans = pAVar11;
  }
  aVar10 = Abc_Clock();
  pAVar11 = p_00->pAigTrans;
  iVar2 = Aig_ManRegNum(p_00->pAigTrans);
  pCVar12 = Cnf_Derive(pAVar11,iVar2);
  p_00->pCnfAig = pCVar12;
  aVar13 = Abc_Clock();
  p_00->timeCnf = (aVar13 - aVar10) + p_00->timeCnf;
  if (pPars->fVerbose != 0) {
    uVar4 = Saig_ManPiNum(pAig);
    uVar5 = Saig_ManPoNum(pAig);
    uVar6 = Saig_ManRegNum(pAig);
    uVar7 = Aig_ManAndNum(pAig);
    uVar8 = Aig_ManLevelNum(pAig);
    printf("AIG: PI/PO/Reg = %d/%d/%d. And = %d. Lev = %d.  CNF: Var/Cla = %d/%d.\n",(ulong)uVar4,
           (ulong)uVar5,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8,p_00->pCnfAig->nVars,
           p_00->pCnfAig->nClauses);
  }
  *piFrame = -1;
  p_00->nFrames = 1;
  RetValue = 0;
  do {
    aVar10 = Abc_Clock();
    if (pPars->fUseBackward == 0) {
      iVar2 = Aig_ManRegNum(pAig);
      pAVar11 = Inter_ManStartInitState(iVar2);
      p_00->pInter = pAVar11;
    }
    else {
      pAVar11 = Inter_ManStartOneOutput(pAig,1);
      p_00->pInter = pAVar11;
    }
    iVar2 = Aig_ManCoNum(p_00->pInter);
    if (iVar2 != 1) {
      __assert_fail("Aig_ManCoNum(p->pInter) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                    ,0x91,
                    "int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)");
    }
    aVar13 = Abc_Clock();
    pCVar12 = Cnf_Derive(p_00->pInter,0);
    p_00->pCnfInter = pCVar12;
    aVar14 = Abc_Clock();
    p_00->timeCnf = (aVar14 - aVar13) + p_00->timeCnf;
    pAVar11 = Inter_ManFramesInter(pAig,p_00->nFrames,pPars->fUseBackward,pPars->fUseTwoFrames);
    p_00->pFrames = pAVar11;
    aVar13 = Abc_Clock();
    if (pPars->fRewrite != 0) {
      pAVar11 = p_00->pFrames;
      pAVar15 = Dar_ManRwsat(pAVar11,1,0);
      p_00->pFrames = pAVar15;
      Aig_ManStop(pAVar11);
    }
    aVar14 = Abc_Clock();
    p_00->timeRwr = (aVar14 - aVar13) + p_00->timeRwr;
    aVar13 = Abc_Clock();
    if (pPars->fUseBackward == 0) {
      pCVar12 = Cnf_DeriveSimple(p_00->pFrames,0);
      p_00->pCnfFrames = pCVar12;
    }
    else {
      pAVar11 = p_00->pFrames;
      iVar2 = Aig_ManCoNum(p_00->pFrames);
      pCVar12 = Cnf_Derive(pAVar11,iVar2);
      p_00->pCnfFrames = pCVar12;
    }
    aVar14 = Abc_Clock();
    p_00->timeCnf = (aVar14 - aVar13) + p_00->timeCnf;
    if (pPars->fVerbose != 0) {
      uVar4 = p_00->nFrames;
      uVar5 = Aig_ManNodeNum(p_00->pFrames);
      uVar6 = Aig_ManLevelNum(p_00->pFrames);
      printf("Step = %2d. Frames = 1 + %d. And = %5d. Lev = %5d.  ",(ulong)(RetValue + 1),
             (ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
      Abc_Print(1,"%s =","Time");
      aVar13 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar13 - aVar10) * 1.0) / 1000000.0);
    }
    if (((pPars->fTransLoop == 0) && (pPars->fUseBackward == 0)) && (pPars->nFramesK < 2)) {
      pAigTemp = (Aig_Man_t *)Inter_CheckStart(p_00->pAigTrans,pPars->nFramesK);
      aVar10 = Abc_Clock();
      pCVar12 = Cnf_Derive(p_00->pInter,1);
      aVar13 = Abc_Clock();
      p_00->timeCnf = (aVar13 - aVar10) + p_00->timeCnf;
      aVar10 = Abc_Clock();
      Inter_CheckPerform((Inter_Check_t *)pAigTemp,pCVar12,local_130);
      aVar13 = Abc_Clock();
      p_00->timeEqu = (aVar13 - aVar10) + p_00->timeEqu;
      Cnf_DataFree(pCVar12);
      if (p_00->vInters != (Vec_Ptr_t *)0x0) {
        pVVar1 = p_00->vInters;
        pAVar11 = Aig_ManDupSimple(p_00->pInter);
        Vec_PtrPush(pVVar1,pAVar11);
      }
    }
    Status = 0;
    while( true ) {
      if ((pPars->nFramesMax != 0) && (pPars->nFramesMax <= p_00->nFrames + Status)) {
        if (pPars->fVerbose != 0) {
          printf("Reached limit (%d) on the number of timeframes.\n");
        }
        aVar10 = Abc_Clock();
        p_00->timeTotal = aVar10 - aVar9;
        Inter_ManStop(p_00,0);
        Inter_CheckStop((Inter_Check_t *)pAigTemp);
        return -1;
      }
      aVar10 = Abc_Clock();
      iVar2 = Inter_ManPerformOneStep(p_00,pPars->fUseBias,pPars->fUseBackward,local_130);
      if (pPars->fVerbose != 0) {
        iVar3 = p_00->nFrames;
        uVar4 = Aig_ManNodeNum(p_00->pInter);
        uVar5 = Aig_ManLevelNum(p_00->pInter);
        printf("   I = %2d. Bmc =%3d. IntAnd =%6d. IntLev =%5d. Conf =%6d.  ",(ulong)(Status + 1),
               (ulong)(uint)(Status + 1 + iVar3),(ulong)uVar4,(ulong)uVar5,
               (ulong)(uint)p_00->nConfCur);
        Abc_Print(1,"%s =","Time");
        aVar13 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar13 - aVar10) * 1.0) / 1000000.0);
      }
      pPars->iFrameMax = Status + -1 + p_00->nFrames;
      if (iVar2 == 0) break;
      if (iVar2 == -1) {
        if ((pPars->nSecLimit == 0) || (aVar10 = Abc_Clock(), aVar10 <= local_130)) {
          if (p_00->nConfCur < p_00->nConfLimit) {
            __assert_fail("p->nConfCur >= p->nConfLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                          ,0x10d,
                          "int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)"
                         );
          }
          if (pPars->fVerbose != 0) {
            printf("Reached limit (%d) on the number of conflicts.\n");
          }
        }
        else if (pPars->fVerbose != 0) {
          printf("Reached timeout (%d seconds).\n");
        }
        aVar10 = Abc_Clock();
        p_00->timeTotal = aVar10 - aVar9;
        Inter_ManStop(p_00,0);
        Inter_CheckStop((Inter_Check_t *)pAigTemp);
        return -1;
      }
      if (iVar2 != 1) {
        __assert_fail("RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                      ,0x116,
                      "int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)");
      }
      aVar10 = Abc_Clock();
      if (p_00->pInterNew != (Aig_Man_t *)0x0) {
        p_00->pInterNew->Time2Quit = local_130;
        pAVar11 = p_00->pInterNew;
        pAVar15 = Dar_ManRwsat(pAVar11,1,0);
        p_00->pInterNew = pAVar15;
        Aig_ManStop(pAVar11);
        if (p_00->pInterNew == (Aig_Man_t *)0x0) {
          printf("Reached timeout (%d seconds) during rewriting.\n",(ulong)(uint)pPars->nSecLimit);
          aVar10 = Abc_Clock();
          p_00->timeTotal = aVar10 - aVar9;
          Inter_ManStop(p_00,1);
          Inter_CheckStop((Inter_Check_t *)pAigTemp);
          return -1;
        }
      }
      aVar13 = Abc_Clock();
      p_00->timeRwr = (aVar13 - aVar10) + p_00->timeRwr;
      if (p_00->pInterNew == (Aig_Man_t *)0x0) {
LAB_007d9b95:
        if (pPars->fVerbose != 0) {
          printf("The problem is trivially true for all states.\n");
        }
        aVar10 = Abc_Clock();
        p_00->timeTotal = aVar10 - aVar9;
        Inter_ManStop(p_00,1);
        Inter_CheckStop((Inter_Check_t *)pAigTemp);
        return 1;
      }
      pAVar16 = Aig_ManCo(p_00->pInterNew,0);
      pAVar16 = Aig_ObjChild0(pAVar16);
      pAVar17 = Aig_ManConst0(p_00->pInterNew);
      if (pAVar16 == pAVar17) goto LAB_007d9b95;
      aVar10 = Abc_Clock();
      if (pPars->fCheckKstep == 0) {
        iVar2 = Aig_ManCiNum(p_00->pInterNew);
        iVar3 = Aig_ManCiNum(p_00->pInter);
        if (iVar2 == iVar3) {
          clk._0_4_ = Inter_ManCheckContainment(p_00->pInterNew,p_00->pInter);
        }
        else {
          clk._0_4_ = 0;
        }
      }
      else {
        iVar2 = Aig_ManCiNum(p_00->pInterNew);
        iVar3 = Aig_ManCiNum(p_00->pInter);
        if (iVar2 == iVar3) {
          if (((pPars->fTransLoop == 0) && (pPars->fUseBackward == 0)) && (pPars->nFramesK < 2)) {
            aVar13 = Abc_Clock();
            pCVar12 = Cnf_Derive(p_00->pInterNew,1);
            aVar14 = Abc_Clock();
            p_00->timeCnf = (aVar14 - aVar13) + p_00->timeCnf;
            aVar14 = Abc_Clock();
            nTimeNewOut = aVar14 - aVar13;
            clk._0_4_ = Inter_CheckPerform((Inter_Check_t *)pAigTemp,pCVar12,local_130);
            Cnf_DataFree(pCVar12);
            if (p_00->vInters != (Vec_Ptr_t *)0x0) {
              pVVar1 = p_00->vInters;
              pAVar11 = Aig_ManDupSimple(p_00->pInterNew);
              Vec_PtrPush(pVVar1,pAVar11);
            }
          }
          else {
            aVar13 = Abc_Clock();
            pAVar11 = p_00->pAigTrans;
            pAVar15 = p_00->pInterNew;
            iVar2 = Abc_MinInt(Status + 1,pPars->nFramesK);
            clk._0_4_ = Inter_ManCheckInductiveContainment
                                  (pAVar11,pAVar15,iVar2,pPars->fUseBackward);
            aVar14 = Abc_Clock();
            nTimeNewOut = aVar14 - aVar13;
          }
        }
        else {
          clk._0_4_ = 0;
        }
      }
      aVar13 = Abc_Clock();
      p_00->timeEqu = ((aVar13 - aVar10) - nTimeNewOut) + p_00->timeEqu;
      if ((int)clk != 0) {
        if (pPars->fVerbose != 0) {
          printf("Proved containment of interpolants.\n");
        }
        aVar10 = Abc_Clock();
        p_00->timeTotal = aVar10 - aVar9;
        Inter_ManStop(p_00,1);
        Inter_CheckStop((Inter_Check_t *)pAigTemp);
        return 1;
      }
      if ((pPars->nSecLimit != 0) && (aVar10 = Abc_Clock(), local_130 < aVar10)) {
        printf("Reached timeout (%d seconds).\n",(ulong)(uint)pPars->nSecLimit);
        aVar10 = Abc_Clock();
        p_00->timeTotal = aVar10 - aVar9;
        Inter_ManStop(p_00,1);
        Inter_CheckStop((Inter_Check_t *)pAigTemp);
        return -1;
      }
      if (pPars->fTransLoop == 0) {
        if (pPars->fUseBackward == 0) {
          Aig_ManStop(p_00->pInter);
          p_00->pInter = p_00->pInterNew;
        }
        else {
          pAVar11 = p_00->pInter;
          pAVar15 = Aig_ManCreateMiter(pAVar11,p_00->pInterNew,2);
          p_00->pInter = pAVar15;
          Aig_ManStop(pAVar11);
          Aig_ManStop(p_00->pInterNew);
          aVar10 = Abc_Clock();
          pAVar11 = p_00->pInter;
          pAVar15 = Dar_ManRwsat(pAVar11,1,0);
          p_00->pInter = pAVar15;
          Aig_ManStop(pAVar11);
          aVar13 = Abc_Clock();
          p_00->timeRwr = (aVar13 - aVar10) + p_00->timeRwr;
        }
      }
      else {
        Aig_ManStop(p_00->pInter);
        p_00->pInter = p_00->pInterNew;
      }
      p_00->pInterNew = (Aig_Man_t *)0x0;
      Cnf_DataFree(p_00->pCnfInter);
      aVar10 = Abc_Clock();
      pCVar12 = Cnf_Derive(p_00->pInter,0);
      p_00->pCnfInter = pCVar12;
      aVar13 = Abc_Clock();
      p_00->timeCnf = (aVar13 - aVar10) + p_00->timeCnf;
      Status = Status + 1;
    }
    if (Status == 0) {
      if (pPars->fVerbose != 0) {
        printf("Found a real counterexample in frame %d.\n",(ulong)(uint)p_00->nFrames);
      }
      aVar10 = Abc_Clock();
      p_00->timeTotal = aVar10 - aVar9;
      *piFrame = p_00->nFrames;
      Saig_ParBmcSetDefaultParams((Saig_ParBmc_t *)&pParsBmc);
      ParsBmc.nStart = 100000000;
      pParsBmc._0_4_ = p_00->nFrames;
      ParsBmc.nLearnedDelta = pPars->fVerbose;
      ParsBmc.pFuncStop._4_4_ = Saig_ManBmcScalable(pAig,(Saig_ParBmc_t *)&pParsBmc);
      if (ParsBmc.pFuncStop._4_4_ == 1) {
        printf("Error: The problem should be SAT but it is UNSAT.\n");
      }
      else if (ParsBmc.pFuncStop._4_4_ == -1) {
        printf("Error: The problem timed out.\n");
      }
      Inter_ManStop(p_00,0);
      Inter_CheckStop((Inter_Check_t *)pAigTemp);
      return 0;
    }
    p_00->nFrames = Status + p_00->nFrames;
    Inter_ManClean(p_00);
    Inter_CheckStop((Inter_Check_t *)pAigTemp);
    RetValue = RetValue + 1;
  } while( true );
}

Assistant:

int Inter_ManPerformInterpolation( Aig_Man_t * pAig, Inter_ManParams_t * pPars, int * piFrame )
{
    extern int Inter_ManCheckInductiveContainment( Aig_Man_t * pTrans, Aig_Man_t * pInter, int nSteps, int fBackward );
    Inter_Man_t * p;
    Inter_Check_t * pCheck = NULL;
    Aig_Man_t * pAigTemp;
    int s, i, RetValue, Status;
    abctime clk, clk2, clkTotal = Abc_Clock(), timeTemp = 0;
    abctime nTimeNewOut = pPars->nSecLimit ? pPars->nSecLimit * CLOCKS_PER_SEC + Abc_Clock() : 0;

    // enable ORing of the interpolants, if containment check is performed inductively with K > 1
    if ( pPars->nFramesK > 1 )
        pPars->fTransLoop = 1;

    // sanity checks
    assert( Saig_ManRegNum(pAig) > 0 );
    assert( Saig_ManPiNum(pAig) > 0 );
    assert( Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) == 1 );
    if ( pPars->fVerbose && Saig_ManConstrNum(pAig) )
        printf( "Performing interpolation with %d constraints...\n", Saig_ManConstrNum(pAig) );

    if ( Inter_ManCheckInitialState(pAig) )
    {
        *piFrame = -1;
        printf( "Property trivially fails in the initial state.\n" );
        return 0;
    }
/*
    if ( Inter_ManCheckAllStates(pAig) )
    {
        printf( "Property trivially holds in all states.\n" );
        return 1;
    }
*/
    // create interpolation manager
    // can perform SAT sweeping and/or rewriting of this AIG...
    p = Inter_ManCreate( pAig, pPars );
    if ( pPars->fTransLoop )
        p->pAigTrans = Inter_ManStartOneOutput( pAig, 0 );
    else
        p->pAigTrans = Inter_ManStartDuplicated( pAig );
    // derive CNF for the transformed AIG
clk = Abc_Clock();
    p->pCnfAig = Cnf_Derive( p->pAigTrans, Aig_ManRegNum(p->pAigTrans) ); 
p->timeCnf += Abc_Clock() - clk;    
    if ( pPars->fVerbose )
    { 
        printf( "AIG: PI/PO/Reg = %d/%d/%d. And = %d. Lev = %d.  CNF: Var/Cla = %d/%d.\n",
            Saig_ManPiNum(pAig), Saig_ManPoNum(pAig), Saig_ManRegNum(pAig), 
            Aig_ManAndNum(pAig), Aig_ManLevelNum(pAig),
            p->pCnfAig->nVars, p->pCnfAig->nClauses );
    }
 
    // derive interpolant
    *piFrame = -1;
    p->nFrames = 1;
    for ( s = 0; ; s++ )
    {
        Cnf_Dat_t * pCnfInter2;

clk2 = Abc_Clock();
        // initial state
        if ( pPars->fUseBackward )
            p->pInter = Inter_ManStartOneOutput( pAig, 1 );
        else
            p->pInter = Inter_ManStartInitState( Aig_ManRegNum(pAig) );
        assert( Aig_ManCoNum(p->pInter) == 1 );
clk = Abc_Clock();
        p->pCnfInter = Cnf_Derive( p->pInter, 0 );  
p->timeCnf += Abc_Clock() - clk;    
        // timeframes
        p->pFrames = Inter_ManFramesInter( pAig, p->nFrames, pPars->fUseBackward, pPars->fUseTwoFrames );
clk = Abc_Clock();
        if ( pPars->fRewrite )
        {
            p->pFrames = Dar_ManRwsat( pAigTemp = p->pFrames, 1, 0 );
            Aig_ManStop( pAigTemp );
//        p->pFrames = Fra_FraigEquivence( pAigTemp = p->pFrames, 100, 0 );
//        Aig_ManStop( pAigTemp );
        }
p->timeRwr += Abc_Clock() - clk;
        // can also do SAT sweeping on the timeframes...
clk = Abc_Clock();
        if ( pPars->fUseBackward )
            p->pCnfFrames = Cnf_Derive( p->pFrames, Aig_ManCoNum(p->pFrames) );  
        else
//            p->pCnfFrames = Cnf_Derive( p->pFrames, 0 );  
            p->pCnfFrames = Cnf_DeriveSimple( p->pFrames, 0 );  
p->timeCnf += Abc_Clock() - clk;    
        // report statistics
        if ( pPars->fVerbose )
        {
            printf( "Step = %2d. Frames = 1 + %d. And = %5d. Lev = %5d.  ", 
                s+1, p->nFrames, Aig_ManNodeNum(p->pFrames), Aig_ManLevelNum(p->pFrames) );
            ABC_PRT( "Time", Abc_Clock() - clk2 );
        }


        //////////////////////////////////////////
        // start containment checking
        if ( !(pPars->fTransLoop || pPars->fUseBackward || pPars->nFramesK > 1) )
        {
            pCheck = Inter_CheckStart( p->pAigTrans, pPars->nFramesK );
            // try new containment check for the initial state
clk = Abc_Clock();
            pCnfInter2 = Cnf_Derive( p->pInter, 1 );  
p->timeCnf += Abc_Clock() - clk;    
clk = Abc_Clock();
            RetValue = Inter_CheckPerform( pCheck, pCnfInter2, nTimeNewOut );
p->timeEqu += Abc_Clock() - clk;
//            assert( RetValue == 0 );
            Cnf_DataFree( pCnfInter2 );
            if ( p->vInters )
                Vec_PtrPush( p->vInters, Aig_ManDupSimple(p->pInter) );
        }
        //////////////////////////////////////////

        // iterate the interpolation procedure
        for ( i = 0; ; i++ )
        {
            if ( pPars->nFramesMax && p->nFrames + i >= pPars->nFramesMax )
            { 
                if ( pPars->fVerbose )
                    printf( "Reached limit (%d) on the number of timeframes.\n", pPars->nFramesMax );
                p->timeTotal = Abc_Clock() - clkTotal;
                Inter_ManStop( p, 0 );
                Inter_CheckStop( pCheck );
                return -1;
            }

            // perform interpolation
            clk = Abc_Clock();
#ifdef ABC_USE_LIBRARIES
            if ( pPars->fUseMiniSat )
            {
                assert( !pPars->fUseBackward );
                RetValue = Inter_ManPerformOneStepM114p( p, pPars->fUsePudlak, pPars->fUseOther );
            }
            else 
#endif
                RetValue = Inter_ManPerformOneStep( p, pPars->fUseBias, pPars->fUseBackward, nTimeNewOut );

            if ( pPars->fVerbose )
            {
                printf( "   I = %2d. Bmc =%3d. IntAnd =%6d. IntLev =%5d. Conf =%6d.  ", 
                    i+1, i + 1 + p->nFrames, Aig_ManNodeNum(p->pInter), Aig_ManLevelNum(p->pInter), p->nConfCur );
                ABC_PRT( "Time", Abc_Clock() - clk );
            }
            // remember the number of timeframes completed
            pPars->iFrameMax = i - 1 + p->nFrames;
            if ( RetValue == 0 ) // found a (spurious?) counter-example
            {
                if ( i == 0 ) // real counterexample
                {
                    if ( pPars->fVerbose )
                        printf( "Found a real counterexample in frame %d.\n", p->nFrames );
                    p->timeTotal = Abc_Clock() - clkTotal;
                    *piFrame = p->nFrames;
//                    pAig->pSeqModel = (Abc_Cex_t *)Inter_ManGetCounterExample( pAig, p->nFrames+1, pPars->fVerbose );
                    {
                        int RetValue;
                        Saig_ParBmc_t ParsBmc, * pParsBmc = &ParsBmc;
                        Saig_ParBmcSetDefaultParams( pParsBmc );
                        pParsBmc->nConfLimit = 100000000;
                        pParsBmc->nStart     = p->nFrames;
                        pParsBmc->fVerbose   = pPars->fVerbose;
                        RetValue = Saig_ManBmcScalable( pAig, pParsBmc );
                        if ( RetValue == 1 )
                            printf( "Error: The problem should be SAT but it is UNSAT.\n" );
                        else if ( RetValue == -1 )
                            printf( "Error: The problem timed out.\n" );
                    }
                    Inter_ManStop( p, 0 );
                    Inter_CheckStop( pCheck );
                    return 0;
                }
                // likely spurious counter-example
                p->nFrames += i;
                Inter_ManClean( p ); 
                break;
            }
            else if ( RetValue == -1 ) 
            {
                if ( pPars->nSecLimit && Abc_Clock() > nTimeNewOut ) // timed out
                {
                    if ( pPars->fVerbose )
                        printf( "Reached timeout (%d seconds).\n",  pPars->nSecLimit );
                }
                else
                {
                    assert( p->nConfCur >= p->nConfLimit );
                    if ( pPars->fVerbose )
                        printf( "Reached limit (%d) on the number of conflicts.\n", p->nConfLimit );
                }
                p->timeTotal = Abc_Clock() - clkTotal;
                Inter_ManStop( p, 0 );
                Inter_CheckStop( pCheck );
                return -1;
            }
            assert( RetValue == 1 ); // found new interpolant
            // compress the interpolant
clk = Abc_Clock();
            if ( p->pInterNew )
            {
                // save the timeout value
                p->pInterNew->Time2Quit = nTimeNewOut;
//                Ioa_WriteAiger( p->pInterNew, "interpol.aig", 0, 0 );
                p->pInterNew = Dar_ManRwsat( pAigTemp = p->pInterNew, 1, 0 );
//                p->pInterNew = Dar_ManRwsat( pAigTemp = p->pInterNew, 0, 0 );
                Aig_ManStop( pAigTemp );
                if ( p->pInterNew == NULL )
                {
                    printf( "Reached timeout (%d seconds) during rewriting.\n",  pPars->nSecLimit );
                    p->timeTotal = Abc_Clock() - clkTotal;
                    Inter_ManStop( p, 1 );
                    Inter_CheckStop( pCheck );
                    return -1;
                }
            }
p->timeRwr += Abc_Clock() - clk;

            // check if interpolant is trivial
            if ( p->pInterNew == NULL || Aig_ObjChild0(Aig_ManCo(p->pInterNew,0)) == Aig_ManConst0(p->pInterNew) )
            { 
//                printf( "interpolant is constant 0\n" );
                if ( pPars->fVerbose )
                    printf( "The problem is trivially true for all states.\n" );
                p->timeTotal = Abc_Clock() - clkTotal;
                Inter_ManStop( p, 1 );
                Inter_CheckStop( pCheck );
                return 1;
            }

            // check containment of interpolants
clk = Abc_Clock();
            if ( pPars->fCheckKstep ) // k-step unique-state induction
            {
                if ( Aig_ManCiNum(p->pInterNew) == Aig_ManCiNum(p->pInter) )
                {
                    if ( pPars->fTransLoop || pPars->fUseBackward || pPars->nFramesK > 1 )
                    {
clk2 = Abc_Clock();
                        Status = Inter_ManCheckInductiveContainment( p->pAigTrans, p->pInterNew, Abc_MinInt(i + 1, pPars->nFramesK), pPars->fUseBackward );
timeTemp = Abc_Clock() - clk2;
                    }
                    else
                    {   // new containment check
clk2 = Abc_Clock();
                        pCnfInter2 = Cnf_Derive( p->pInterNew, 1 );  
p->timeCnf += Abc_Clock() - clk2;
timeTemp = Abc_Clock() - clk2;
            
                        Status = Inter_CheckPerform( pCheck, pCnfInter2, nTimeNewOut );
                        Cnf_DataFree( pCnfInter2 );
                        if ( p->vInters )
                            Vec_PtrPush( p->vInters, Aig_ManDupSimple(p->pInterNew) );
                    }
                }
                else
                    Status = 0;
            }
            else // combinational containment
            {
                if ( Aig_ManCiNum(p->pInterNew) == Aig_ManCiNum(p->pInter) )
                    Status = Inter_ManCheckContainment( p->pInterNew, p->pInter );
                else
                    Status = 0;
            }
p->timeEqu += Abc_Clock() - clk - timeTemp;
            if ( Status ) // contained
            {
                if ( pPars->fVerbose )
                    printf( "Proved containment of interpolants.\n" );
                p->timeTotal = Abc_Clock() - clkTotal;
                Inter_ManStop( p, 1 );
                Inter_CheckStop( pCheck );
                return 1;
            }
            if ( pPars->nSecLimit && Abc_Clock() > nTimeNewOut )
            {
                printf( "Reached timeout (%d seconds).\n",  pPars->nSecLimit );
                p->timeTotal = Abc_Clock() - clkTotal;
                Inter_ManStop( p, 1 );
                Inter_CheckStop( pCheck );
                return -1;
            }
            // save interpolant and convert it into CNF
            if ( pPars->fTransLoop )
            {
                Aig_ManStop( p->pInter );
                p->pInter = p->pInterNew; 
            }
            else
            {
                if ( pPars->fUseBackward )
                {
                    p->pInter = Aig_ManCreateMiter( pAigTemp = p->pInter, p->pInterNew, 2 );
                    Aig_ManStop( pAigTemp );
                    Aig_ManStop( p->pInterNew );
                    // compress the interpolant
clk = Abc_Clock();
                    p->pInter = Dar_ManRwsat( pAigTemp = p->pInter, 1, 0 );
                    Aig_ManStop( pAigTemp );
p->timeRwr += Abc_Clock() - clk;
                }
                else // forward with the new containment checking (using only the frontier)
                {
                    Aig_ManStop( p->pInter );
                    p->pInter = p->pInterNew; 
                }
            }
            p->pInterNew = NULL;
            Cnf_DataFree( p->pCnfInter );
clk = Abc_Clock();
            p->pCnfInter = Cnf_Derive( p->pInter, 0 );  
p->timeCnf += Abc_Clock() - clk;
        }

        // start containment checking
        Inter_CheckStop( pCheck );
    }
    assert( 0 );
    return RetValue;
}